

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_random_unit.cpp
# Opt level: O0

Roaring64Map * make_random_bitset64(void)

{
  bool bVar1;
  int iVar2;
  Roaring64Map *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  uint64_t element;
  uint64_t rnk;
  uint64_t card;
  uint64_t start_2;
  uint64_t start_1;
  uint64_t start;
  int i;
  int num_ops;
  Roaring64Map *r;
  int in_stack_ffffffffffffff3c;
  Roaring64Map *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  fd_set *in_stack_ffffffffffffff58;
  Roaring64Map *in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  Roaring64Map *in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff78;
  Roaring64Map *in_stack_ffffffffffffff80;
  __fd_mask local_58;
  char *local_50;
  fd_set *local_48;
  uint64_t local_40;
  uint64_t local_38;
  long local_30;
  int local_14;
  int local_10;
  undefined1 local_9;
  Roaring64Map *this;
  
  local_9 = 0;
  this = in_RDI;
  doublechecked::Roaring64Map::Roaring64Map(in_stack_ffffffffffffff40);
  local_10 = rand();
  local_10 = local_10 % 100;
  for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
    iVar2 = rand();
    switch(iVar2 % 5) {
    case 0:
      doublechecked::Roaring64Map::add
                ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (uint64_t)in_stack_ffffffffffffff48);
      break;
    case 1:
      in_stack_ffffffffffffff80 = (Roaring64Map *)gravity64;
      iVar2 = rand();
      local_30 = (long)in_stack_ffffffffffffff80 + (long)(iVar2 % 0x32) + -0x19;
      rand();
      doublechecked::Roaring64Map::addRange
                (in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58,
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      break;
    case 2:
      in_stack_ffffffffffffff70 = (Roaring64Map *)gravity64;
      iVar2 = rand();
      in_stack_ffffffffffffff78 = (long)in_stack_ffffffffffffff70 + (long)(iVar2 % 10) + -5;
      local_38 = in_stack_ffffffffffffff78;
      rand();
      doublechecked::Roaring64Map::removeRange
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (uint64_t)in_stack_ffffffffffffff60);
      break;
    case 3:
      in_stack_ffffffffffffff60 = (Roaring64Map *)gravity64;
      iVar2 = rand();
      in_stack_ffffffffffffff68 = (long)in_stack_ffffffffffffff60 + (long)(iVar2 % 0x32) + -0x19;
      local_40 = in_stack_ffffffffffffff68;
      rand();
      doublechecked::Roaring64Map::flip
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (uint64_t)in_stack_ffffffffffffff70);
      break;
    case 4:
      in_stack_ffffffffffffff58 =
           (fd_set *)
           doublechecked::Roaring64Map::cardinality
                     ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
      ;
      local_48 = in_stack_ffffffffffffff58;
      if (in_stack_ffffffffffffff58 != (fd_set *)0x0) {
        iVar2 = rand();
        local_50 = (char *)((ulong)(long)iVar2 % (ulong)local_48);
        local_58 = 0;
        iVar2 = doublechecked::Roaring64Map::select
                          (in_RDI,(int)local_50,(fd_set *)&stack0xffffffffffffffa8,local_48,in_R8,
                           in_R9);
        in_stack_ffffffffffffff57 = (undefined1)iVar2;
        _assert_true(CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff3c);
        in_stack_ffffffffffffff40 = (Roaring64Map *)(local_50 + 1);
        in_stack_ffffffffffffff48 =
             (char *)doublechecked::Roaring64Map::rank
                               (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        _assert_int_equal(CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40
                          ,in_stack_ffffffffffffff3c);
        doublechecked::Roaring64Map::remove(in_RDI,local_50);
      }
      break;
    default:
      _assert_true(CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff3c);
    }
    iVar2 = rand();
    gravity64 = (long)(iVar2 % 200 + -100) + gravity64;
  }
  bVar1 = doublechecked::Roaring64Map::does_std_set_match_roaring(this);
  _assert_true(CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
               CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c));
  return in_RDI;
}

Assistant:

Roaring64Map make_random_bitset64() {
    Roaring64Map r;
    int num_ops = rand() % 100;
    for (int i = 0; i < num_ops; ++i) {
        switch (rand() % 5) {
            case 0:
                r.add(gravity64);
                break;

            case 1: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.addRange(start, start + rand() % 100);
                break;
            }

            case 2: {
                uint64_t start = gravity64 + (rand() % 10) - 5;
                r.removeRange(start, start + rand() % 5);
                break;
            }

            case 3: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.flip(start, start + rand() % 50);
                break;
            }

            case 4: {  // tests remove(), select(), rank()
                uint64_t card = r.cardinality();
                if (card != 0) {
                    uint64_t rnk = rand() % card;
                    uint64_t element = 0;
                    assert_true(r.select(rnk, &element));
                    assert_int_equal(rnk + 1, r.rank(element));
                    r.remove(rnk);
                }
                break;
            }

            default:
                assert_true(false);
        }
        gravity64 += (rand() % 200) - 100;
    }
    assert_true(r.does_std_set_match_roaring());
    return r;
}